

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoder::LossyDctDecoder
          (LossyDctDecoder *this,vector<char_*,_std::allocator<char_*>_> *rowPtrs,char *packedAc,
          char *packedDc,unsigned_short *toLinear,int width,int height,PixelType type)

{
  LossyDctDecoderBase::LossyDctDecoderBase
            (&this->super_LossyDctDecoderBase,packedAc,packedDc,toLinear,width,height);
  (this->super_LossyDctDecoderBase)._vptr_LossyDctDecoderBase =
       (_func_int **)&PTR__LossyDctDecoderBase_00421450;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(&(this->super_LossyDctDecoderBase)._rowPtrs,rowPtrs);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (&(this->super_LossyDctDecoderBase)._type,&type);
  return;
}

Assistant:

LossyDctDecoder
        (std::vector<char *> &rowPtrs,
         char *packedAc,
         char *packedDc,
         const unsigned short *toLinear,
         int width,
         int height,
         PixelType type)
    :
        LossyDctDecoderBase(packedAc, packedDc, toLinear, width, height)
    {
        _rowPtrs.push_back(rowPtrs);
        _type.push_back(type);
    }